

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

void Abc_EnumerateCubeStatesZdd(void)

{
  int iVar1;
  int iVar2;
  int b;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Abc_ZddMan *p_00;
  abctime aVar6;
  int ZddAllPrev;
  int t;
  abctime clk;
  int ZddAll;
  int ZddTurns;
  int ZddTurn3;
  int ZddTurn2;
  int ZddTurn1;
  int nSize;
  int pPerm [24];
  int pComb [9];
  uint local_fc;
  int k;
  int i;
  Abc_ZddMan *p;
  int local_e8;
  int LogObj;
  int pXYZ [3] [9] [2];
  
  memcpy(&local_e8,&DAT_00ba8900,0xd8);
  aVar5 = Abc_Clock();
  printf("Enumerating states of 2x2x2 cube.\n");
  p_00 = Abc_ZddManAlloc(0x114,0x8000000);
  Abc_ZddManCreatePerms(p_00,0x18);
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",0,1,0,2);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - aVar5);
  clk._4_4_ = 1;
  for (local_fc = 0; (int)local_fc < 3; local_fc = local_fc + 1) {
    for (pComb[8] = 0; pComb[8] < 0x18; pComb[8] = pComb[8] + 1) {
      (&ZddTurn1)[pComb[8]] = pComb[8];
    }
    for (pComb[8] = 0; pComb[8] < 9; pComb[8] = pComb[8] + 1) {
      iVar1 = (&ZddTurn1)[(&local_e8)[(long)(int)local_fc * 0x12 + (long)pComb[8] * 2] + -1];
      (&ZddTurn1)[(&local_e8)[(long)(int)local_fc * 0x12 + (long)pComb[8] * 2] + -1] =
           (&ZddTurn1)[pXYZ[(long)(int)local_fc + -1][(long)pComb[8] + 8][1] + -1];
      (&ZddTurn1)[pXYZ[(long)(int)local_fc + -1][(long)pComb[8] + 8][1] + -1] = iVar1;
    }
    iVar1 = Abc_ZddPerm2Comb(&ZddTurn1,0x18,pPerm + 0x16);
    if (iVar1 != 9) {
      __assert_fail("nSize == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                    ,0x36b,"void Abc_EnumerateCubeStatesZdd()");
    }
    for (pComb[8] = 0; pComb[8] < 9; pComb[8] = pComb[8] + 1) {
      iVar1 = Abc_ZddVarIJ(p_00,pPerm[(long)pComb[8] + 0x16] >> 0x10,
                           pPerm[(long)pComb[8] + 0x16] & 0xffff);
      pPerm[(long)pComb[8] + 0x16] = iVar1;
    }
    iVar1 = Abc_ZddBuildSet(p_00,pPerm + 0x16,9);
    iVar2 = Abc_ZddUnion(p_00,clk._4_4_,iVar1);
    b = Abc_ZddPermProduct(p_00,iVar1,iVar1);
    iVar2 = Abc_ZddUnion(p_00,iVar2,b);
    iVar1 = Abc_ZddPermProduct(p_00,b,iVar1);
    clk._4_4_ = Abc_ZddUnion(p_00,iVar2,iVar1);
  }
  uVar3 = Abc_ZddCountPaths(p_00,clk._4_4_);
  uVar4 = Abc_ZddCountNodes(p_00,clk._4_4_);
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",1,(ulong)uVar3,(ulong)uVar4,
         (ulong)(uint)p_00->nObjs);
  aVar6 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar6 - aVar5);
  clk._0_4_ = clk._4_4_;
  for (local_fc = 2; (int)local_fc < 0x65; local_fc = local_fc + 1) {
    iVar1 = Abc_ZddPermProduct(p_00,(int)clk,clk._4_4_);
    uVar3 = Abc_ZddCountPaths(p_00,iVar1);
    uVar4 = Abc_ZddCountNodes(p_00,iVar1);
    printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",(ulong)local_fc,(ulong)uVar3,(ulong)uVar4,
           (ulong)(uint)p_00->nObjs);
    aVar6 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar6 - aVar5);
    if ((int)clk == iVar1) break;
    clk._0_4_ = iVar1;
  }
  Abc_ZddManFree(p_00);
  return;
}

Assistant:

void Abc_EnumerateCubeStatesZdd()
{
    int pXYZ[3][9][2] = {
        { {3, 5}, {3,17}, {3,15}, {1, 6}, {1,16}, {1,14}, {2, 4}, {2,18}, {2,13} },
        { {2,14}, {2,24}, {2,12}, {3,13}, {3,23}, {3,10}, {1,15}, {1,22}, {1,11} },
        { {1,10}, {1, 7}, {1, 4}, {3,12}, {3, 9}, {3, 6}, {2,11}, {2, 8}, {2, 5} }  };
#ifdef WIN32
    int LogObj = 24;
#else
    int LogObj = 27;
#endif
    Abc_ZddMan * p;
    int i, k, pComb[9], pPerm[24], nSize;
    int ZddTurn1, ZddTurn2, ZddTurn3, ZddTurns, ZddAll;
    abctime clk = Abc_Clock();
    printf( "Enumerating states of 2x2x2 cube.\n" );
    p = Abc_ZddManAlloc( 24 * 23 / 2, 1 << LogObj ); // finished with 2^27 (4 GB)
    Abc_ZddManCreatePerms( p, 24 );
    // init state
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 0, 1, 0, 2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // first 9 states
    ZddTurns = 1;
    for ( i = 0; i < 3; i++ )
    {
        for ( k = 0; k < 24; k++ )
            pPerm[k] = k;
        for ( k = 0; k < 9; k++ )
            ABC_SWAP( int, pPerm[pXYZ[i][k][0]-1], pPerm[pXYZ[i][k][1]-1] );
        nSize = Abc_ZddPerm2Comb( pPerm, 24, pComb );
        assert( nSize == 9 );
        for ( k = 0; k < 9; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xffff );
        // add first turn
        ZddTurn1  = Abc_ZddBuildSet( p, pComb, 9 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn1 );
        //Abc_ZddPrint( p, ZddTurn1 );
        // add second turn
        ZddTurn2 = Abc_ZddPermProduct( p, ZddTurn1, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn2 );
        //Abc_ZddPrint( p, ZddTurn2 );
        // add third turn
        ZddTurn3 = Abc_ZddPermProduct( p, ZddTurn2, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn3 );
        //Abc_ZddPrint( p, ZddTurn3 );
        //printf( "\n" );
    }
    //Abc_ZddPrint( p, ZddTurns );
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 1, Abc_ZddCountPaths(p, ZddTurns), Abc_ZddCountNodes(p, ZddTurns), p->nObjs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // other states
    ZddAll = ZddTurns;
    for ( i = 2; i <= 100; i++ )
    {
        int ZddAllPrev = ZddAll;
        ZddAll = Abc_ZddPermProduct( p, ZddAll, ZddTurns );
        printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", i, Abc_ZddCountPaths(p, ZddAll), Abc_ZddCountNodes(p, ZddAll), p->nObjs );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( ZddAllPrev == ZddAll )
            break;
    }
    Abc_ZddManFree( p );
}